

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::PrintOutputAsJson(cmCTestMultiProcessHandler *this)

{
  ptrdiff_t *ppVar1;
  cmCTestTestHandler *this_00;
  cmCTestTestProperties *prop;
  bool bVar2;
  int n;
  Value *pVVar3;
  reference ppVar4;
  size_type sVar5;
  reference __lhs;
  StreamWriter *__p;
  pointer pSVar6;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> local_598;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> jout;
  String local_588;
  Value local_568;
  undefined1 local_540 [8];
  StreamWriterBuilder builder;
  undefined1 local_4e8 [8];
  Value testInfo;
  undefined1 local_4b8 [8];
  cmCTestRunTest testRun;
  cmWorkingDirectory workdir;
  cmCTestTestProperties *p;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *it;
  iterator __end1;
  iterator __begin1;
  PropertiesMap *__range1;
  Value tests;
  BacktraceData backtraceGraph;
  Value local_60;
  undefined1 local_38 [8];
  Value result;
  cmCTestMultiProcessHandler *this_local;
  
  this_00 = this->TestHandler;
  result.limit_ = (ptrdiff_t)this;
  n = FindMaxIndex(this);
  cmCTestTestHandler::SetMaxIndex(this_00,n);
  Json::Value::Value((Value *)local_38,objectValue);
  Json::Value::Value(&local_60,"ctestInfo");
  pVVar3 = Json::Value::operator[]((Value *)local_38,"kind");
  Json::Value::operator=(pVVar3,&local_60);
  Json::Value::~Value(&local_60);
  DumpVersion((Value *)&backtraceGraph.Nodes.limit_,1,0);
  pVVar3 = Json::Value::operator[]((Value *)local_38,"version");
  ppVar1 = &backtraceGraph.Nodes.limit_;
  Json::Value::operator=(pVVar3,(Value *)ppVar1);
  Json::Value::~Value((Value *)ppVar1);
  BacktraceData::BacktraceData((BacktraceData *)&tests.limit_);
  Json::Value::Value((Value *)&__range1,arrayValue);
  __end1 = std::
           map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ::begin(&(this->Properties).
                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  );
  it = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
       std::
       map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ::end(&(this->Properties).
              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            );
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar2) {
      BacktraceData::Dump((Value *)&builder.settings_.limit_,(BacktraceData *)&tests.limit_);
      pVVar3 = Json::Value::operator[]((Value *)local_38,"backtraceGraph");
      ppVar1 = &builder.settings_.limit_;
      Json::Value::operator=(pVVar3,(Value *)ppVar1);
      Json::Value::~Value((Value *)ppVar1);
      pVVar3 = Json::Value::operator[]((Value *)local_38,"tests");
      Json::Value::operator=(pVVar3,(Value *)&__range1);
      Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_540);
      Json::Value::Value(&local_568,"  ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_588,"indentation",
                 (allocator<char> *)
                 ((long)&jout._M_t.
                         super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
                         .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl + 7));
      pVVar3 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_540,&local_588);
      Json::Value::operator=(pVVar3,&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&jout._M_t.
                         super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
                         .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl + 7));
      Json::Value::~Value(&local_568);
      __p = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_540);
      std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
      unique_ptr<std::default_delete<Json::StreamWriter>,void>
                ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)
                 &local_598,__p);
      pSVar6 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::
               operator->(&local_598);
      (*pSVar6->_vptr_StreamWriter[2])(pSVar6,local_38,&std::cout);
      std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
                (&local_598);
      Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_540);
      Json::Value::~Value((Value *)&__range1);
      BacktraceData::~BacktraceData((BacktraceData *)&tests.limit_);
      Json::Value::~Value((Value *)local_38);
      return;
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator*(&__end1);
    prop = ppVar4->second;
    cmWorkingDirectory::cmWorkingDirectory
              ((cmWorkingDirectory *)&testRun.TotalNumberOfTests,&prop->Directory);
    cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_4b8,this);
    cmCTestRunTest::SetIndex((cmCTestRunTest *)local_4b8,prop->Index);
    cmCTestRunTest::SetTestProperties((cmCTestRunTest *)local_4b8,prop);
    cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_4b8);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&prop->Args);
    if (sVar5 < 2) {
LAB_009cc1e3:
      DumpCTestInfo((Value *)local_4e8,(cmCTestRunTest *)local_4b8,prop,
                    (BacktraceData *)&tests.limit_);
      Json::Value::append((Value *)&__range1,(Value *)local_4e8);
      Json::Value::~Value((Value *)local_4e8);
      testInfo.limit_._4_4_ = 0;
    }
    else {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&prop->Args,1);
      bVar2 = std::operator==(__lhs,"NOT_AVAILABLE");
      if (!bVar2) goto LAB_009cc1e3;
      testInfo.limit_._4_4_ = 3;
    }
    cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_4b8);
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&testRun.TotalNumberOfTests);
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void cmCTestMultiProcessHandler::PrintOutputAsJson()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  Json::Value result = Json::objectValue;
  result["kind"] = "ctestInfo";
  result["version"] = DumpVersion(1, 0);

  BacktraceData backtraceGraph;
  Json::Value tests = Json::arrayValue;
  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);
    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments();

    // Skip tests not available in this configuration.
    if (p.Args.size() >= 2 && p.Args[1] == "NOT_AVAILABLE") {
      continue;
    }

    Json::Value testInfo = DumpCTestInfo(testRun, p, backtraceGraph);
    tests.append(testInfo);
  }
  result["backtraceGraph"] = backtraceGraph.Dump();
  result["tests"] = std::move(tests);

  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());
  jout->write(result, &std::cout);
}